

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::saveFile(Recorder *this,string *filename)

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ext;
  size_type lastP;
  string *in_stack_00000458;
  Recorder *in_stack_00000460;
  string *in_stack_00000588;
  Recorder *in_stack_00000590;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  char in_stack_ffffffffffffffaf;
  size_type in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(in_RDI,in_stack_ffffffffffffffaf,0x178d2e);
  if (sVar2 == 0xffffffffffffffff) {
    std::__cxx11::string::string(in_stack_ffffffffffffffc0);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (in_stack_ffffffffffffffc8,(size_type)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
  }
  bVar1 = std::operator==(in_RDI,(char *)CONCAT17(in_stack_ffffffffffffffaf,
                                                  CONCAT16(in_stack_ffffffffffffffae,
                                                           in_stack_ffffffffffffffa8)));
  if (!bVar1) {
    bVar1 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffae,
                                                                   in_stack_ffffffffffffffa8)));
    if (!bVar1) {
      writeTextFile(in_stack_00000460,in_stack_00000458);
      goto LAB_00178de4;
    }
  }
  writeJsonFile(in_stack_00000590,in_stack_00000588);
LAB_00178de4:
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

void Recorder::saveFile(const std::string& filename)
{
    auto lastP = filename.find_last_of('.');
    auto ext = (lastP != std::string::npos) ? filename.substr(lastP) : std::string{};
    if ((ext == ".json") || (ext == ".JSON")) {
        writeJsonFile(filename);
    } else {
        writeTextFile(filename);
    }
}